

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-backend-reg.cpp
# Opt level: O2

bool striequals(char *a,char *b)

{
  char cVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  
  lVar5 = 0;
  while( true ) {
    cVar1 = a[lVar5];
    cVar2 = b[lVar5];
    if ((cVar1 == '\0') || (cVar2 == '\0')) break;
    iVar3 = tolower((int)cVar1);
    iVar4 = tolower((int)cVar2);
    if (iVar3 != iVar4) {
      return false;
    }
    lVar5 = lVar5 + 1;
  }
  return cVar1 == cVar2;
}

Assistant:

static bool striequals(const char * a, const char * b) {
    for (; *a && *b; a++, b++) {
        if (std::tolower(*a) != std::tolower(*b)) {
            return false;
        }
    }
    return *a == *b;
}